

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

void commit_v_x4(uint8_t **digest,uint8_t **input,msgs_t *msgs,picnic_instance_t *params)

{
  long in_RCX;
  long in_RDX;
  size_t i;
  hash_context_x4 ctx;
  uint8_t **in_stack_fffffffffffffc78;
  hash_context_x4 *in_stack_fffffffffffffc80;
  size_t size;
  uint8_t *data3;
  uint8_t *in_stack_fffffffffffffca8;
  uint8_t *in_stack_fffffffffffffcb0;
  uint8_t *in_stack_fffffffffffffcb8;
  hash_context_x4 *in_stack_fffffffffffffcc0;
  
  hash_init_x4(in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78);
  hash_update_x4(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,0x146f8f);
  for (data3 = (uint8_t *)0x0; data3 < (uint8_t *)(ulong)*(byte *)(in_RCX + 0xb); data3 = data3 + 1)
  {
    in_stack_fffffffffffffc80 = *(hash_context_x4 **)(in_RDX + (long)data3 * 8);
    size = *(size_t *)(in_RDX + 0x1b0 + (long)data3 * 8);
    numBytes((uint32_t)*(undefined8 *)(in_RDX + 0x80));
    hash_update_x4_4(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     in_stack_fffffffffffffca8,data3,size);
  }
  hash_final_x4((hash_context_x4 *)0x14706c);
  hash_squeeze_x4(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,0x14708c);
  return;
}

Assistant:

static void commit_v_x4(uint8_t** digest, const uint8_t** input, const msgs_t* msgs,
                        const picnic_instance_t* params) {
  hash_context_x4 ctx;

  hash_init_x4(&ctx, params->digest_size);
  hash_update_x4(&ctx, input, params->input_output_size);
  for (size_t i = 0; i < params->num_MPC_parties; i++) {
    assert(msgs[0].pos == msgs[1].pos && msgs[2].pos == msgs[3].pos && msgs[0].pos == msgs[2].pos);
    hash_update_x4_4(&ctx, msgs[0].msgs[i], msgs[1].msgs[i], msgs[2].msgs[i], msgs[3].msgs[i],
                     numBytes(msgs->pos));
  }
  hash_final_x4(&ctx);
  hash_squeeze_x4(&ctx, digest, params->digest_size);
  hash_clear_x4(&ctx);
}